

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint32_t helper_float_round_2008_w_d_mips(CPUMIPSState *env,uint64_t fdt0)

{
  uint uVar1;
  int iVar2;
  uintptr_t unaff_retaddr;
  uint32_t local_1c;
  uint32_t wt2;
  uint64_t fdt0_local;
  CPUMIPSState *env_local;
  
  set_float_rounding_mode(0,&(env->active_fpu).fp_status);
  local_1c = float64_to_int32_mips(fdt0,&(env->active_fpu).fp_status);
  restore_rounding_mode(env);
  uVar1 = get_float_exception_flags(&(env->active_fpu).fp_status);
  if (((uVar1 & 1) != 0) && (iVar2 = float64_is_any_nan(fdt0), iVar2 != 0)) {
    local_1c = 0;
  }
  update_fcr31(env,unaff_retaddr);
  return local_1c;
}

Assistant:

uint32_t helper_float_round_2008_w_d(CPUMIPSState *env, uint64_t fdt0)
{
    uint32_t wt2;

    set_float_rounding_mode(float_round_nearest_even,
            &env->active_fpu.fp_status);
    wt2 = float64_to_int32(fdt0, &env->active_fpu.fp_status);
    restore_rounding_mode(env);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
            & float_flag_invalid) {
        if (float64_is_any_nan(fdt0)) {
            wt2 = 0;
        }
    }
    update_fcr31(env, GETPC());
    return wt2;
}